

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

CgreenVector * create_cgreen_vector(_func_void_void_ptr *destructor)

{
  CgreenVector *pCVar1;
  
  pCVar1 = (CgreenVector *)malloc(0x20);
  pCVar1->size = 0;
  pCVar1->destructor = destructor;
  pCVar1->space = 0;
  pCVar1->items = (void **)0x0;
  return pCVar1;
}

Assistant:

CgreenVector *create_cgreen_vector(void (*destructor)(void *)) {
    CgreenVector *vector = (CgreenVector *)malloc(sizeof(CgreenVector));
    vector->size = 0;
    vector->destructor = destructor;
    vector->space = 0;
    vector->items = NULL;
    return vector;
}